

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O2

void Abc_TgPurgeSymmetry(Abc_TgMan_t *pMan,int fHigh)

{
  ulong *puVar1;
  ulong *puVar2;
  char *pcVar3;
  ulong *puVar4;
  byte bVar5;
  char cVar6;
  uint uVar7;
  word *pIn;
  bool bVar8;
  long lVar9;
  bool bVar10;
  char cVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  ulong uVar15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  ulong *puVar19;
  long lVar20;
  ulong uVar21;
  uint uVar22;
  long lVar23;
  uint uVar24;
  ulong *puVar25;
  ulong uVar26;
  byte bVar27;
  bool bVar28;
  ulong local_118 [3];
  long local_100;
  int scnt [16];
  int fDone [16];
  uint auStack_78 [18];
  
  uVar7 = pMan->nVars;
  lVar23 = (long)(int)uVar7;
  local_118[0] = 0;
  local_118[1] = 0;
  if (pMan->fPhased == 0) {
    uVar12 = 1 << ((char)uVar7 - 6U & 0x1f);
    lVar20 = 0;
    uVar21 = 0;
    if (0 < (int)uVar12) {
      uVar21 = (ulong)uVar12;
    }
    bVar27 = 0;
    for (; lVar20 < pMan->pGroup[0].nGVars; lVar20 = lVar20 + 1) {
      bVar5 = pMan->pPerm[lVar20];
      uVar13 = (uint)(char)bVar5;
      if ((char)bVar5 < '\0') {
        __assert_fail("jVar >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauCanon.c"
                      ,0x792,"void Abc_TgPurgeSymmetry(Abc_TgMan_t *, int)");
      }
      if ((int)uVar7 <= (int)uVar13) {
        __assert_fail("iVar < nVars",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                      ,0x582,"int Abc_TtHasVar(word *, int, int)");
      }
      puVar25 = pMan->pTruth;
      if ((int)uVar7 < 7) {
        if ((s_Truths6Neg[uVar13] & (*puVar25 >> ((byte)(1 << (bVar5 & 0x1f)) & 0x3f) ^ *puVar25))
            == 0) {
LAB_0042f147:
          pMan->symLink[uVar13] = pMan->symLink[lVar23];
          pMan->symLink[lVar23] = bVar5;
          pMan->pPerm[lVar20] = -1;
          bVar27 = bVar27 + 1;
        }
      }
      else {
        if (5 < bVar5) {
          uVar22 = 1 << (bVar5 - 6 & 0x1f);
          puVar1 = puVar25 + (int)uVar12;
          iVar16 = 2 << (bVar5 - 6 & 0x1f);
          uVar26 = 0;
          if (0 < (int)uVar22) {
            uVar26 = (ulong)uVar22;
          }
          puVar19 = puVar25 + (int)uVar22;
          for (; puVar25 < puVar1; puVar25 = puVar25 + iVar16) {
            uVar15 = 0;
            while (uVar26 != uVar15) {
              puVar2 = puVar25 + uVar15;
              puVar4 = puVar19 + uVar15;
              uVar15 = uVar15 + 1;
              if (*puVar2 != *puVar4) goto LAB_0042f16d;
            }
            puVar19 = puVar19 + iVar16;
          }
          goto LAB_0042f147;
        }
        uVar26 = 0;
        do {
          if (uVar21 == uVar26) goto LAB_0042f147;
          puVar1 = puVar25 + uVar26;
          uVar26 = uVar26 + 1;
        } while ((s_Truths6Neg[uVar13] & (*puVar1 >> ((byte)(1 << (bVar5 & 0x1f)) & 0x3f) ^ *puVar1)
                 ) == 0);
      }
LAB_0042f16d:
    }
    local_118[0] = (ulong)bVar27;
  }
  lVar20 = 0;
  while( true ) {
    uVar12 = pMan->nGroups;
    if ((int)uVar12 <= lVar20) break;
    bVar28 = true;
    if (lVar20 == 0) {
      bVar28 = pMan->fPhased != 0;
    }
    cVar11 = pMan->pGroup[lVar20].nGVars;
    uVar12 = (uint)cVar11;
    cVar6 = pMan->pGroup[lVar20].iStart;
    uVar21 = 0;
    if ('\0' < cVar11) {
      uVar21 = (ulong)uVar12;
    }
    for (uVar26 = 0; uVar21 != uVar26; uVar26 = uVar26 + 1) {
      fDone[uVar26] = 0;
      scnt[uVar26] = 1;
    }
    local_100 = lVar20;
    lVar9 = (long)cVar6 + 0x1c;
    uVar13 = 1;
    if (1 < (int)uVar12) {
      uVar13 = uVar12;
    }
    cVar11 = '\0';
    uVar26 = 0;
    uVar21 = 1;
    bVar10 = false;
    do {
      for (; bVar8 = bVar10, lVar20 = local_100, uVar26 != uVar13 - 1; uVar26 = uVar26 + 1) {
        uVar22 = (uint)pMan->pPerm[uVar26 + lVar9 + -0x1c];
        if ((-1 < pMan->pPerm[uVar26 + lVar9 + -0x1c]) && (fDone[uVar26] == 0)) {
          local_118[2] = uVar26;
          for (uVar15 = uVar21; uVar15 != uVar12; uVar15 = uVar15 + 1) {
            uVar24 = (uint)pMan->pPerm[uVar15 + lVar9 + -0x1c];
            uVar18 = 0;
            if ((-1 < pMan->pPerm[uVar15 + lVar9 + -0x1c]) && (scnt[uVar15] == scnt[uVar26])) {
              if (scnt[uVar15] == 1) {
                iVar16 = pMan->nVars;
                pIn = pMan->pTruth;
                iVar14 = 1 << ((char)iVar16 - 6U & 0x1f);
                if (iVar16 < 7) {
                  iVar14 = 1;
                }
                Abc_TtCopy(pSymCopy,pIn,iVar14,0);
                Abc_TtSwapVars(pSymCopy,iVar16,uVar22,uVar24);
                iVar16 = Abc_TtEqual(pIn,pSymCopy,iVar14);
                uVar18 = iVar16 * 2;
                if (!bVar28) {
                  Abc_TtFlip(pSymCopy,iVar14,uVar22);
                  Abc_TtFlip(pSymCopy,iVar14,uVar24);
                  uVar24 = Abc_TtEqual(pIn,pSymCopy,iVar14);
                  uVar18 = uVar18 | uVar24;
                }
              }
              else {
                iVar16 = 1 << ((char)pMan->nVars - 6U & 0x1f);
                if (pMan->nVars < 7) {
                  iVar16 = 1;
                }
                Abc_TtCopy(pSymCopy,pMan->pTruth,iVar16,0);
                uVar18 = uVar22;
                for (uVar17 = uVar24; (-1 < (int)uVar18 && (-1 < (int)uVar17));
                    uVar17 = (uint)pMan->symLink[uVar17]) {
                  Abc_TtSwapVars(pSymCopy,pMan->nVars,uVar18,uVar17);
                  uVar18 = (uint)pMan->symLink[uVar18];
                }
                if ((-1 < (int)uVar18) || (-1 < (int)uVar17)) {
                  __assert_fail("iv < 0 && jv < 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauCanon.c"
                                ,0x6fb,"int Abc_TtIsSymmetricHigh(Abc_TgMan_t *, int, int, int)");
                }
                iVar14 = Abc_TtEqual(pMan->pTruth,pSymCopy,iVar16);
                uVar18 = iVar14 * 2;
                uVar17 = uVar22;
                if (!bVar28) {
                  for (; (-1 < (int)uVar17 && (-1 < (int)uVar24));
                      uVar24 = (uint)pMan->symLink[uVar24]) {
                    if (pMan->symPhase[uVar17] != '\0') {
                      Abc_TtFlip(pSymCopy,iVar16,uVar17);
                    }
                    if (pMan->symPhase[uVar24] != '\0') {
                      Abc_TtFlip(pSymCopy,iVar16,uVar24);
                    }
                    uVar17 = (int)pMan->symLink[uVar17];
                  }
                  uVar24 = Abc_TtEqual(pMan->pTruth,pSymCopy,iVar16);
                  uVar18 = uVar18 | uVar24;
                  uVar26 = local_118[2];
                }
              }
            }
            auStack_78[uVar15] = uVar18;
          }
          fDone[uVar26] = 1;
          for (uVar15 = uVar21; uVar15 != uVar12; uVar15 = uVar15 + 1) {
            cVar6 = pMan->pPerm[uVar15 + lVar9 + -0x1c];
            uVar24 = (uint)cVar6;
            uVar18 = auStack_78[uVar15];
            if (uVar18 == 1) {
              Abc_TgFlipSymGroupByVar(pMan,uVar24);
LAB_0042f567:
              pMan->symPhase[uVar22] = pMan->symPhase[uVar22] + pMan->symPhase[cVar6];
              uVar18 = uVar22;
LAB_0042f57d:
              do {
                uVar24 = uVar18;
                uVar18 = (int)pMan->symLink[uVar24];
              } while (-1 < pMan->symLink[uVar24]);
              pMan->symLink[uVar24] = cVar6;
              pMan->pPerm[uVar15 + lVar9 + -0x1c] = -1;
              scnt[uVar26] = scnt[uVar26] + scnt[uVar15];
              fDone[uVar26] = 0;
              cVar11 = cVar11 + '\x01';
              bVar8 = true;
            }
            else {
              if (uVar18 == 2) goto LAB_0042f567;
              if (uVar18 == 3) {
                for (; uVar18 = uVar22, -1 < (int)uVar24; uVar24 = (uint)pMan->symLink[uVar24]) {
                  pMan->symPhase[uVar24] = '\0';
                }
                goto LAB_0042f57d;
              }
            }
          }
        }
        uVar21 = uVar21 + 1;
        bVar10 = bVar8;
      }
      if (fHigh == 0) break;
      uVar26 = 0;
      uVar21 = 1;
      bVar10 = false;
    } while (bVar8);
    *(char *)((long)local_118 + local_100) = *(char *)((long)local_118 + local_100) + cVar11;
    lVar20 = lVar20 + 1;
  }
  uVar26 = 0;
  uVar21 = 0;
  if (0 < (int)uVar7) {
    uVar21 = (ulong)uVar7;
  }
  do {
    uVar15 = uVar21;
    if (uVar21 == uVar26) {
LAB_0042f62a:
      do {
        lVar20 = (long)(int)uVar15 << 0x20;
        uVar26 = (long)(int)uVar15;
        do {
          uVar15 = uVar26 + 1;
          if (lVar23 <= (long)uVar15) {
            uVar21 = 0;
            uVar26 = 0;
            if (0 < (int)uVar12) {
              uVar26 = (ulong)uVar12;
            }
            iVar16 = 0;
            for (; uVar26 != uVar21; uVar21 = uVar21 + 1) {
              cVar11 = *(char *)((long)local_118 + uVar21);
              pcVar3 = &pMan->pGroup[uVar21].nGVars;
              *pcVar3 = *pcVar3 - cVar11;
              pMan->pGroup[uVar21].iStart = pMan->pGroup[uVar21].iStart - (char)iVar16;
              iVar16 = iVar16 + cVar11;
            }
            if (pMan->pGroup[0].nGVars == '\0') {
              pMan->nGroups = uVar12 - 1;
              memmove(pMan->pGroup,pMan->pGroup + 1,(long)(int)uVar12 * 2 - 2);
              if (pMan->pGroup[0].iStart != '\0') {
                __assert_fail("pMan->pGroup[0].iStart == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauCanon.c"
                              ,0x7b2,"void Abc_TgPurgeSymmetry(Abc_TgMan_t *, int)");
              }
            }
            pMan->nGVars = pMan->nGVars - iVar16;
            return;
          }
          lVar20 = lVar20 + 0x100000000;
          lVar9 = uVar26 + 1;
          uVar26 = uVar15;
        } while (pMan->pPerm[lVar9] < '\0');
        pMan->pPerm[uVar21] = pMan->pPerm[lVar20 >> 0x20];
        uVar21 = uVar21 + 1;
      } while( true );
    }
    if (pMan->pPerm[uVar26] < '\0') {
      uVar21 = uVar26;
      uVar15 = uVar26 & 0xffffffff;
      goto LAB_0042f62a;
    }
    uVar26 = uVar26 + 1;
  } while( true );
}

Assistant:

static void Abc_TgPurgeSymmetry(Abc_TgMan_t * pMan, int fHigh)
{
    int i, j, k, sum = 0, nVars = pMan->nVars;
    signed char *symLink = pMan->symLink;
    char gcnt[16] = { 0 };
    char * pPerm = pMan->pPerm;

    // purge unsupported variables
    if (!pMan->fPhased)
    {
        int iVar = pMan->nVars;
        for (j = 0; j < pMan->pGroup[0].nGVars; j++)
        {
            int jVar = pPerm[j];
            assert(jVar >= 0);
            if (!Abc_TtHasVar(pMan->pTruth, nVars, jVar))
            {
                symLink[jVar] = symLink[iVar];
                symLink[iVar] = jVar;
                pPerm[j] = -1;
                gcnt[0]++;
            }
        }
    }

    for (k = 0; k < pMan->nGroups; k++)
        gcnt[k] += Abc_TgGroupSymmetry(pMan, pMan->pGroup + k, fHigh);

    for (i = 0; i < nVars && pPerm[i] >= 0; i++)
        ;
    for (j = i + 1; ; i++, j++)
    {
        while (j < nVars && pPerm[j] < 0) j++;
        if (j >= nVars) break;
        pPerm[i] = pPerm[j];
    }
    for (k = 0; k < pMan->nGroups; k++)
    {
        pMan->pGroup[k].nGVars -= gcnt[k];
        pMan->pGroup[k].iStart -= sum;
        sum += gcnt[k];
    }
    if (pMan->pGroup[0].nGVars == 0)
    {
        pMan->nGroups--;
        memmove(pMan->pGroup, pMan->pGroup + 1, sizeof(TiedGroup) * pMan->nGroups);
        assert(pMan->pGroup[0].iStart == 0);
    }
    pMan->nGVars -= sum;
}